

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::Transaction::SetFromHex(Transaction *this,string *hex_string)

{
  wally_tx_input *pwVar1;
  uint32_t version;
  uchar *puVar2;
  wally_tx_output *pwVar3;
  Transaction *pTVar4;
  bool bVar5;
  wally_tx_witness_stack *pwVar6;
  CfdException *pCVar7;
  ulong uVar8;
  uint8_t *p_byte_data;
  undefined4 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer data_size;
  Amount AVar13;
  int ret;
  wally_tx *tx_pointer;
  Transaction *local_1e8;
  wally_tx *local_1e0;
  undefined4 local_1d4;
  wally_tx_input *local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  size_t num_size;
  bool local_1a0;
  uint64_t txout_num;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> vout_work;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> vin_work;
  ByteData tx_byte;
  allocator_type local_f8 [24];
  TxIn txin;
  ScriptWitness local_50;
  
  local_1e0 = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  vin_work.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vin_work.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vin_work.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tx_pointer = (wally_tx *)0x0;
  local_1e8 = this;
  ret = wally_tx_from_hex((hex_string->_M_dataplus)._M_p,0,&tx_pointer);
  if (ret != -2) {
    if (ret != 0) goto LAB_002c210f;
    if (tx_pointer->num_inputs != 0) {
      uVar9 = 0;
      goto LAB_002c1db9;
    }
    uVar9 = 0;
    if ((tx_pointer->num_outputs != 0) || (uVar9 = 0, hex_string->_M_string_length < 0x15))
    goto LAB_002c1db9;
    wally_tx_free(tx_pointer);
    tx_pointer = (wally_tx *)0x0;
    ret = -2;
  }
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txin,(string *)hex_string);
  ByteData::ByteData(&tx_byte,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txin);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin);
  ByteData::GetBytes(&witness_buf,&tx_byte);
  if ((hex_string->_M_string_length < 0x14) ||
     (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[4] != '\0')) {
LAB_002c1d95:
    uVar9 = 0;
  }
  else {
    version = *(uint32_t *)
               witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((hex_string->_M_string_length == 0x14) &&
       (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[5] == '\0')) {
      ret = wally_tx_init_alloc(version,*(uint32_t *)
                                         (witness_buf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 6),0,0,
                                &tx_pointer);
      if (ret != 0) {
        txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
        txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x152;
        txin.super_AbstractTxIn.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "SetFromHex";
        logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_init_alloc NG[{}] ",&ret);
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&txin,"transaction data generate error.",(allocator *)&txout_num);
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&txin);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
      txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x156;
      txin.super_AbstractTxIn.txid_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "SetFromHex";
      logger::info<>((CfdSourceLocation *)&txin,"call wally_tx_init_alloc");
      goto LAB_002c1d95;
    }
    txout_num = 0;
    num_size = 0;
    p_byte_data = witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 5;
    data_size = witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                (-9 - (long)witness_buf.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    bVar5 = AbstractTransaction::GetVariableInt(p_byte_data,(size_t)data_size,&txout_num,&num_size);
    if (!bVar5) goto LAB_002c1d95;
    bVar5 = CheckTxOutBuffer(p_byte_data,(size_t)data_size,txout_num,num_size,(void *)0x0,
                             (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0);
    if (!bVar5) goto LAB_002c1d95;
    ret = wally_tx_init_alloc(version,*(uint32_t *)(p_byte_data + (long)data_size),0,0,&tx_pointer);
    if (ret != 0) {
      txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
      txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x16d;
      txin.super_AbstractTxIn.txid_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "SetFromHex";
      logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_init_alloc NG[{}] ",&ret);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&txin,"transaction data generate error.",(allocator *)local_f8);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&txin);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
    txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x172;
    txin.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "SetFromHex";
    logger::info<>((CfdSourceLocation *)&txin,"call wally_tx_init_alloc");
    uVar9 = (undefined4)CONCAT71((uint7)(uint3)(version >> 8),1);
    CheckTxOutBuffer(p_byte_data,(size_t)data_size,txout_num,num_size,tx_pointer,&vout_work);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_byte);
  if (ret == 0) {
LAB_002c1db9:
    (local_1e8->super_AbstractTransaction).wally_tx_pointer_ = tx_pointer;
    local_1d4 = uVar9;
    for (uVar12 = 0; uVar12 < tx_pointer->num_inputs; uVar12 = uVar12 + 1) {
      pwVar1 = tx_pointer->inputs + uVar12;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&txout_num,pwVar1->txhash,
                 (uchar *)&tx_pointer->inputs[uVar12].index,
                 (allocator_type *)&txin.super_AbstractTxIn);
      local_1d0 = pwVar1;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&num_size,pwVar1->script,
                 pwVar1->script + pwVar1->script_len,(allocator_type *)&txin.super_AbstractTxIn);
      ByteData::ByteData((ByteData *)&txin.super_AbstractTxIn,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&num_size);
      Script::Script((Script *)&tx_byte,(ByteData *)&txin.super_AbstractTxIn);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &txin.super_AbstractTxIn);
      ByteData256::ByteData256
                ((ByteData256 *)local_f8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_num);
      Txid::Txid((Txid *)&witness_buf,(ByteData256 *)local_f8);
      pwVar1 = local_1d0;
      TxIn::TxIn((TxIn *)&txin.super_AbstractTxIn,(Txid *)&witness_buf,local_1d0->index,
                 local_1d0->sequence,(Script *)&tx_byte);
      Txid::~Txid((Txid *)&witness_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
      pwVar6 = pwVar1->witness;
      if ((pwVar6 != (wally_tx_witness_stack *)0x0) && (uVar8 = pwVar6->num_items, uVar8 != 0)) {
        lVar10 = 8;
        for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
          puVar2 = *(uchar **)((long)pwVar6->items + lVar10 + -8);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                     puVar2 + *(long *)((long)&pwVar6->items->witness + lVar10),local_f8);
          ByteData::ByteData((ByteData *)local_f8,&witness_buf);
          AbstractTxIn::AddScriptWitnessStack
                    (&local_50,&txin.super_AbstractTxIn,(ByteData *)local_f8);
          ScriptWitness::~ScriptWitness(&local_50);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_buf);
          pwVar6 = local_1d0->witness;
          uVar8 = pwVar6->num_items;
          lVar10 = lVar10 + 0x10;
        }
      }
      ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
                (&vin_work,(value_type *)&txin.super_AbstractTxIn);
      AbstractTxIn::~AbstractTxIn(&txin.super_AbstractTxIn);
      Script::~Script((Script *)&tx_byte);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&num_size);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_num);
    }
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
    txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x1a7;
    txin.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "SetFromHex";
    logger::info<unsigned_long&>
              ((CfdSourceLocation *)&txin,"num_outputs={} ",&tx_pointer->num_outputs);
    if ((char)local_1d4 == '\0') {
      lVar10 = 0x10;
      for (uVar12 = 0; uVar12 < tx_pointer->num_outputs; uVar12 = uVar12 + 1) {
        pwVar3 = tx_pointer->outputs;
        puVar2 = *(uchar **)((long)pwVar3 + lVar10 + -8);
        ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                   puVar2 + *(long *)((long)&pwVar3->satoshi + lVar10),(allocator_type *)&txin);
        AVar13 = Amount::CreateBySatoshiAmount(*(int64_t *)((long)pwVar3 + lVar10 + -0x10));
        num_size = AVar13.amount_;
        local_1a0 = AVar13.ignore_check_;
        ByteData::ByteData((ByteData *)&txout_num,&witness_buf);
        Script::Script((Script *)&tx_byte,(ByteData *)&txout_num);
        TxOut::TxOut((TxOut *)&txin,(Amount *)&num_size,(Script *)&tx_byte);
        Script::~Script((Script *)&tx_byte);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_num);
        ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                  (&vout_work,(value_type *)&txin);
        AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&txin);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        lVar10 = lVar10 + 0x70;
      }
    }
    pTVar4 = local_1e8;
    if (local_1e0 != (wally_tx *)0x0) {
      wally_tx_free(local_1e0);
      ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::clear(&pTVar4->vin_);
      ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::clear(&pTVar4->vout_);
    }
    pTVar4 = local_1e8;
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator=
              (&local_1e8->vin_,&vin_work);
    ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator=
              (&pTVar4->vout_,&vout_work);
    ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&vout_work);
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::~vector(&vin_work);
    return;
  }
LAB_002c210f:
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4f071e;
  txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x17f;
  txin.super_AbstractTxIn.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "SetFromHex";
  logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_from_hex NG[{}] ",&ret);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&txin,"transaction data invalid.",(allocator *)&tx_byte);
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&txin);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Transaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  bool append_txout = false;
  std::vector<TxIn> vin_work;
  std::vector<TxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_from_hex(hex_string.c_str(), 0, &tx_pointer);
  if (ret == WALLY_OK) {
    if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0) &&
        (hex_string.size() > kTransactionMinimumHexSize)) {
      // Judged as an invalid analysis condition when txin is 0 and txout is 1,
      // and enters the exception route
      // (libwally misidentifies as witness tx)
      wally_tx_free(tx_pointer);
      tx_pointer = NULL;
      ret = WALLY_EINVAL;
    }
  }

  if (ret == WALLY_EINVAL) {
    ByteData tx_byte = StringUtil::StringToByte(hex_string);
    const std::vector<uint8_t> &tx_buf = tx_byte.GetBytes();
    const uint8_t *address_pointer = tx_buf.data();

    // If the minimum size, perform analysis
    if (hex_string.size() >= kTransactionMinimumHexSize) {
      uint32_t version = 0;
      uint32_t lock_time = 0;
      memcpy(&version, address_pointer, sizeof(version));
      address_pointer += sizeof(version);
      if (*address_pointer != 0) {
        // marker is 1 or txin is greater than 1
        // Since type can be analyzed with libwally, treated as invalid data.
      } else {
        // txin is 0 or marker is 0
        ++address_pointer;
        if ((*address_pointer == 0) &&
            (hex_string.size() == kTransactionMinimumHexSize)) {
          // txout is 0
          ++address_pointer;
          memcpy(&lock_time, address_pointer, sizeof(lock_time));
          ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "transaction data generate error.");
          }
          info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
        } else {
          // Check remaining size and check if txin is 0 and txout is 1 or more
          const uint8_t *start_address = tx_buf.data();
          size_t size = address_pointer - start_address;
          uint64_t txout_num = 0;
          size_t num_size = 0;
          // Subtract the size up to the txout area and the locktime
          // from the txbuf size.
          size_t buf_size = tx_buf.size() - size - sizeof(uint32_t);
          if (!GetVariableInt(
                  address_pointer, buf_size, &txout_num, &num_size)) {
            // Invalid
          } else if (!CheckTxOutBuffer(
                         address_pointer, buf_size, txout_num, num_size)) {
            // Invalid
          } else {
            // txout OK
            // locktime copy
            const uint8_t *work_address = address_pointer + buf_size;
            memcpy(&lock_time, work_address, sizeof(lock_time));
            ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
              throw CfdException(
                  kCfdIllegalArgumentError,
                  "transaction data generate error.");
            }
            info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
            append_txout = true;
            // Add data to TxOut again
            CheckTxOutBuffer(
                address_pointer, buf_size, txout_num, num_size, tx_pointer,
                &vout_work);
          }
        }
      }
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create TxIn and TxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      TxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script);
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    if (!append_txout) {
      for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
        struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
        std::vector<uint8_t> script_buf(
            txout_item->script, txout_item->script + txout_item->script_len);
        TxOut txout(
            Amount::CreateBySatoshiAmount(txout_item->satoshi),
            Script(ByteData(script_buf)));
        vout_work.push_back(txout);
      }
    }
    // If the copy process is successful, free the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}